

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Int24_To_UInt8(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                   int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  uchar *src;
  char *pcVar1;
  bool bVar2;
  
  pcVar1 = (char *)((long)sourceBuffer + 2);
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    *(char *)destinationBuffer = *pcVar1 + -0x80;
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
    pcVar1 = pcVar1 + sourceStride * 3;
  }
  return;
}

Assistant:

static void Int24_To_UInt8(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;

    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        /* src[0] is discarded */
        /* src[1] is discarded */
        *dest = (unsigned char)(src[2] + 128);
#elif defined(PA_BIG_ENDIAN)
        *dest = (unsigned char)(src[0] + 128);
        /* src[1] is discarded */
        /* src[2] is discarded */
#endif

        src += sourceStride * 3;
        dest += destinationStride;
    }
}